

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding_util_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::pixie::EncodingUtilTest_TestDecodeNegativePrices_Test::TestBody
          (EncodingUtilTest_TestDecodeNegativePrices_Test *this)

{
  double unaff_RBX;
  char *pcVar1;
  double unaff_R14;
  AssertHelper in_stack_ffffffffffffffc8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffd0;
  AssertionResult gtest_ar;
  
  bidfx_public_api::price::pixie::EncodingUtil::DecodeDecimal(-0x17fccde60,8);
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffffd0.ptr_,(char *)in_stack_ffffffffffffffc8.data_,
             (char *)0x197355,unaff_R14,unaff_RBX,(double)gtest_ar.message_.ptr_);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/encoding_util_test.cpp"
               ,0x2a,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffc8,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffc8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&stack0xffffffffffffffd0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  bidfx_public_api::price::pixie::EncodingUtil::DecodeDecimal(-0x26612260,8);
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffffd0.ptr_,(char *)in_stack_ffffffffffffffc8.data_,
             (char *)0x1973fa,unaff_R14,unaff_RBX,(double)gtest_ar.message_.ptr_);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/encoding_util_test.cpp"
               ,0x2b,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffc8,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffc8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&stack0xffffffffffffffd0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  bidfx_public_api::price::pixie::EncodingUtil::DecodeDecimal(-6410000000,8);
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffffd0.ptr_,(char *)in_stack_ffffffffffffffc8.data_,
             (char *)0x19749f,unaff_R14,unaff_RBX,(double)gtest_ar.message_.ptr_);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/encoding_util_test.cpp"
               ,0x2c,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffc8,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffc8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&stack0xffffffffffffffd0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  bidfx_public_api::price::pixie::EncodingUtil::DecodeDecimal(-6499999999,8);
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffffd0.ptr_,(char *)in_stack_ffffffffffffffc8.data_,
             (char *)0x197540,unaff_R14,unaff_RBX,(double)gtest_ar.message_.ptr_);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/encoding_util_test.cpp"
               ,0x2d,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffc8,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffc8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&stack0xffffffffffffffd0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  bidfx_public_api::price::pixie::EncodingUtil::DecodeDecimal(-0x17d784001,8);
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffffd0.ptr_,(char *)in_stack_ffffffffffffffc8.data_,
             (char *)0x1975e8,unaff_R14,unaff_RBX,(double)gtest_ar.message_.ptr_);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/encoding_util_test.cpp"
               ,0x2e,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffc8,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffc8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&stack0xffffffffffffffd0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  bidfx_public_api::price::pixie::EncodingUtil::DecodeDecimal(-0x8ae03f0,8);
  testing::internal::DoubleNearPredFormat
            ((char *)in_stack_ffffffffffffffd0.ptr_,(char *)in_stack_ffffffffffffffc8.data_,
             (char *)0x19768d,unaff_R14,unaff_RBX,(double)gtest_ar.message_.ptr_);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/encoding_util_test.cpp"
               ,0x2f,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffc8,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffc8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&stack0xffffffffffffffd0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(EncodingUtilTest, TestDecodeNegativePrices)
{
    int32_t scale = 8;
    EXPECT_NEAR(-64.391, EncodingUtil::DecodeDecimal(-6439100000L, scale), DELTA);
    EXPECT_NEAR(-6.439, EncodingUtil::DecodeDecimal(-643900000L, scale), DELTA);
    EXPECT_NEAR(-64.1, EncodingUtil::DecodeDecimal(-6410000000L, scale), DELTA);
    EXPECT_NEAR(-64.99999999, EncodingUtil::DecodeDecimal(-6499999999L, scale), DELTA);
    EXPECT_NEAR(-64.00000001, EncodingUtil::DecodeDecimal(-6400000001L, scale), DELTA);
    EXPECT_NEAR(-1.45622, EncodingUtil::DecodeDecimal(-145622000L, scale), DELTA);
}